

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O0

pair<const_char_*,_unsigned_int> google::protobuf::internal::ReadTagFallback(char *p,uint32 res)

{
  pair<const_char_*,_unsigned_int> pVar1;
  int local_44;
  void *local_40;
  char *local_38;
  uint local_2c;
  uint local_28;
  uint32 byte;
  uint32_t i;
  uint32 res_local;
  char *p_local;
  undefined4 local_10;
  
  local_28 = 2;
  byte = res;
  do {
    _i = p;
    if (4 < local_28) {
      local_40 = (void *)0x0;
      local_44 = 0;
      std::pair<const_char_*,_unsigned_int>::pair<std::nullptr_t,_int,_true>
                ((pair<const_char_*,_unsigned_int> *)&p_local,&local_40,&local_44);
LAB_00289542:
      pVar1._12_4_ = 0;
      pVar1.first = p_local;
      pVar1.second = local_10;
      return pVar1;
    }
    local_2c = (uint)(byte)p[local_28];
    byte = (local_2c - 1 << ((char)local_28 * '\a' & 0x1fU)) + byte;
    if (local_2c < 0x80) {
      local_38 = p + (ulong)local_28 + 1;
      std::pair<const_char_*,_unsigned_int>::pair<const_char_*,_unsigned_int_&,_true>
                ((pair<const_char_*,_unsigned_int> *)&p_local,&local_38,&byte);
      goto LAB_00289542;
    }
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

std::pair<const char*, uint32> ReadTagFallback(const char* p, uint32 res) {
  for (std::uint32_t i = 2; i < 5; i++) {
    uint32 byte = static_cast<uint8>(p[i]);
    res += (byte - 1) << (7 * i);
    if (PROTOBUF_PREDICT_TRUE(byte < 128)) {
      return {p + i + 1, res};
    }
  }
  return {nullptr, 0};
}